

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsm_client_data.c
# Opt level: O0

int initialize_hsm_system(void)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  int result;
  
  l._4_4_ = 0;
  iVar1 = hsm_client_x509_init();
  if (iVar1 != 0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/provisioning_client/adapters/hsm_client_data.c"
                ,"initialize_hsm_system",0x20,1,"Failure initializing x509 system");
    }
    l._4_4_ = 0x21;
  }
  if ((l._4_4_ == 0) && (iVar1 = hsm_client_tpm_init(), iVar1 != 0)) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/provisioning_client/adapters/hsm_client_data.c"
                ,"initialize_hsm_system",0x27,1,"Failure initializing tpm system");
    }
    l._4_4_ = 0x28;
  }
  return l._4_4_;
}

Assistant:

int initialize_hsm_system(void)
{
    int result = 0;
#if defined(HSM_TYPE_X509) || defined(HSM_TYPE_RIOT) || defined(HSM_AUTH_TYPE_CUSTOM)
    // Initialize x509
    if ((result == 0) && (hsm_client_x509_init() != 0))
    {
        LogError("Failure initializing x509 system");
        result = __LINE__;
    }
#endif
#if defined(HSM_TYPE_SAS_TOKEN)  || defined(HSM_AUTH_TYPE_CUSTOM)
    if ((result == 0) && (hsm_client_tpm_init() != 0))
    {
        LogError("Failure initializing tpm system");
        result = __LINE__;
    }
#endif
#ifdef HSM_TYPE_HTTP_EDGE
    if ((result == 0) && (hsm_client_http_edge_init() != 0))
    {
        LogError("Failure initializing http edge system");
        result = __LINE__;
    }
#endif

    return result;
}